

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O0

void circular_memcpy(uint8_t *dst,uint8_t *window,uint64_t mask,int64_t start,int64_t end)

{
  size_t __n;
  ssize_t len2;
  ssize_t len1;
  int64_t end_local;
  int64_t start_local;
  uint64_t mask_local;
  uint8_t *window_local;
  uint8_t *dst_local;
  
  if ((end & mask) < (start & mask)) {
    __n = (mask + 1) - (start & mask);
    memcpy(dst,window + (start & mask),__n);
    memcpy(dst + __n,window,end & mask);
  }
  else {
    memcpy(dst,window + (start & mask),end - start);
  }
  return;
}

Assistant:

static void circular_memcpy(uint8_t* dst, uint8_t* window, const uint64_t mask,
    int64_t start, int64_t end)
{
	if((start & mask) > (end & mask)) {
		ssize_t len1 = mask + 1 - (start & mask);
		ssize_t len2 = end & mask;

		memcpy(dst, &window[start & mask], len1);
		memcpy(dst + len1, window, len2);
	} else {
		memcpy(dst, &window[start & mask], (size_t) (end - start));
	}
}